

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecInt.h
# Opt level: O0

void Vec_IntFillExtra(Vec_Int_t *p,int nSize,int Fill)

{
  int iVar1;
  int local_1c;
  int i;
  int Fill_local;
  int nSize_local;
  Vec_Int_t *p_local;
  
  if (p->nSize < nSize) {
    iVar1 = p->nCap * 2;
    if (nSize == iVar1 || SBORROW4(nSize,iVar1) != nSize + p->nCap * -2 < 0) {
      if (p->nCap < nSize) {
        Vec_IntGrow(p,p->nCap << 1);
      }
    }
    else {
      Vec_IntGrow(p,nSize);
    }
    for (local_1c = p->nSize; local_1c < nSize; local_1c = local_1c + 1) {
      p->pArray[local_1c] = Fill;
    }
    p->nSize = nSize;
  }
  return;
}

Assistant:

static inline void Vec_IntFillExtra( Vec_Int_t * p, int nSize, int Fill )
{
    int i;
    if ( nSize <= p->nSize )
        return;
    if ( nSize > 2 * p->nCap )
        Vec_IntGrow( p, nSize );
    else if ( nSize > p->nCap )
        Vec_IntGrow( p, 2 * p->nCap );
    for ( i = p->nSize; i < nSize; i++ )
        p->pArray[i] = Fill;
    p->nSize = nSize;
}